

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTimer.hpp
# Opt level: O1

void __thiscall Timer::Timer(Timer *this,function<void_()> *func,long *interval)

{
  (this->m_func).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_func)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_func).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_func).super__Function_base._M_functor + 8) = 0;
  (this->m_thread)._M_id._M_thread = 0;
  this->m_running = false;
  std::function<void_()>::operator=(&this->m_func,func);
  this->m_interval = *interval;
  return;
}

Assistant:

Timer(std::function<void(void)> func, const long &interval) {
        m_func = func;
        m_interval = interval;
    }